

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O3

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  secp256k1_ge_storage (*paasVar5) [64] [16];
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  secp256k1_gej *psVar9;
  secp256k1_gej *psVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  secp256k1_ge_storage local_e8;
  secp256k1_scalar local_a8;
  secp256k1_ge local_88;
  
  psVar9 = &ctx->initial;
  psVar10 = r;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (psVar10->x).n[0] = (psVar9->x).n[0];
    psVar9 = (secp256k1_gej *)((psVar9->x).n + 1);
    psVar10 = (secp256k1_gej *)((psVar10->x).n + 1);
  }
  secp256k1_scalar_add(&local_a8,gn,&ctx->blind);
  local_88.infinity = 0;
  uVar15 = 0;
  uVar16 = 0;
  uVar17 = 0;
  uVar18 = 0;
  lVar6 = 0x20;
  uVar8 = 0;
  uVar19 = 0;
  uVar20 = 0;
  uVar21 = 0;
  uVar22 = 0;
  uVar23 = 0;
  uVar24 = 0;
  uVar25 = 0;
  uVar26 = 0;
  uVar27 = 0;
  uVar28 = 0;
  uVar29 = 0;
  uVar30 = 0;
  do {
    paasVar5 = ctx->prec;
    uVar7 = 0;
    do {
      uVar14 = (uint)(((uint)(local_a8.d[uVar8 >> 4 & 0xfffffff] >> ((char)uVar8 * '\x04' & 0x3fU))
                      & 0xf) << 6 == uVar7);
      uVar11 = (int)(uVar14 << 0x1f) >> 0x1f;
      uVar12 = (int)(uVar14 << 0x1f) >> 0x1f;
      uVar13 = (int)(uVar14 << 0x1f) >> 0x1f;
      uVar14 = (int)(uVar14 << 0x1f) >> 0x1f;
      puVar2 = (uint *)((long)paasVar5[-1][0x3f][0xf].y.n + uVar7 + lVar6);
      puVar3 = (uint *)((long)paasVar5[-1][0x3f][0xf].y.n + uVar7 + lVar6 + 0x10);
      puVar1 = (uint *)((long)(*paasVar5)[0][0].x.n + uVar7 + lVar6);
      puVar4 = (uint *)((long)(*paasVar5)[0][0].x.n + uVar7 + lVar6 + 0x10);
      uVar19 = ~uVar11 & uVar19 | *puVar3 & uVar11;
      uVar20 = ~uVar12 & uVar20 | puVar3[1] & uVar12;
      uVar21 = ~uVar13 & uVar21 | puVar3[2] & uVar13;
      uVar22 = ~uVar14 & uVar22 | puVar3[3] & uVar14;
      uVar15 = ~uVar11 & uVar15 | *puVar2 & uVar11;
      uVar16 = ~uVar12 & uVar16 | puVar2[1] & uVar12;
      uVar17 = ~uVar13 & uVar17 | puVar2[2] & uVar13;
      uVar18 = ~uVar14 & uVar18 | puVar2[3] & uVar14;
      uVar27 = ~uVar11 & uVar27 | *puVar4 & uVar11;
      uVar28 = ~uVar12 & uVar28 | puVar4[1] & uVar12;
      uVar29 = ~uVar13 & uVar29 | puVar4[2] & uVar13;
      uVar30 = ~uVar14 & uVar30 | puVar4[3] & uVar14;
      uVar23 = ~uVar11 & uVar23 | *puVar1 & uVar11;
      uVar24 = ~uVar12 & uVar24 | puVar1[1] & uVar12;
      uVar25 = ~uVar13 & uVar25 | puVar1[2] & uVar13;
      uVar26 = ~uVar14 & uVar26 | puVar1[3] & uVar14;
      uVar7 = uVar7 + 0x40;
    } while (uVar7 != 0x400);
    local_e8.x.n[0]._0_4_ = uVar15;
    local_e8.x.n[0]._4_4_ = uVar16;
    local_e8.x.n[1]._0_4_ = uVar17;
    local_e8.x.n[1]._4_4_ = uVar18;
    local_e8.x.n[2]._0_4_ = uVar19;
    local_e8.x.n[2]._4_4_ = uVar20;
    local_e8.x.n[3]._0_4_ = uVar21;
    local_e8.x.n[3]._4_4_ = uVar22;
    local_e8.y.n[0]._0_4_ = uVar23;
    local_e8.y.n[0]._4_4_ = uVar24;
    local_e8.y.n[1]._0_4_ = uVar25;
    local_e8.y.n[1]._4_4_ = uVar26;
    local_e8.y.n[2]._0_4_ = uVar27;
    local_e8.y.n[2]._4_4_ = uVar28;
    local_e8.y.n[3]._0_4_ = uVar29;
    local_e8.y.n[3]._4_4_ = uVar30;
    secp256k1_ge_from_storage(&local_88,&local_e8);
    secp256k1_gej_add_ge(r,r,&local_88);
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 0x400;
  } while (uVar8 != 0x40);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < 64; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * 4, 4);
        for (i = 0; i < 16; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}